

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O0

char * sinc_get_name(int src_enum)

{
  char *pcStack_10;
  int src_enum_local;
  
  if (src_enum == 0) {
    pcStack_10 = "Best Sinc Interpolator";
  }
  else if (src_enum == 1) {
    pcStack_10 = "Medium Sinc Interpolator";
  }
  else if (src_enum == 2) {
    pcStack_10 = "Fastest Sinc Interpolator";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

LIBSAMPLERATE_DLL_PRIVATE const char*
sinc_get_name (int src_enum)
{
	switch (src_enum)
	{	case SRC_SINC_BEST_QUALITY :
			return "Best Sinc Interpolator" ;

		case SRC_SINC_MEDIUM_QUALITY :
			return "Medium Sinc Interpolator" ;

		case SRC_SINC_FASTEST :
			return "Fastest Sinc Interpolator" ;

		default: break ;
		} ;

	return NULL ;
}